

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPreData.cpp
# Opt level: O3

void __thiscall HPreData::makeACopy(HPreData *this)

{
  vector<int,_std::allocator<int>_> *this_00;
  pointer piVar1;
  int *piVar2;
  pointer piVar3;
  pointer pdVar4;
  pointer pdVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  vector<int,_std::allocator<int>_> iwork;
  allocator_type local_45;
  value_type local_44;
  vector<int,_std::allocator<int>_> local_40;
  
  local_44 = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_40,(long)this->numColOriginal,&local_44,&local_45);
  this_00 = &this->Astart;
  local_44 = 0;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (this_00,(long)this->numColOriginal + 1,&local_44);
  uVar12 = (uint)((ulong)((long)(this->ARindex).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data._M_start) >> 2);
  std::vector<int,_std::allocator<int>_>::resize(&this->Aindex,(long)(int)uVar12);
  std::vector<double,_std::allocator<double>_>::resize(&this->Avalue,(long)(int)uVar12);
  if (0 < (int)uVar12) {
    piVar1 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = 0;
    do {
      iVar8 = piVar1[uVar6];
      if (iVar8 < this->numColOriginal) {
        local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar8] =
             local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[iVar8] + 1;
      }
      uVar6 = uVar6 + 1;
    } while ((uVar12 & 0x7fffffff) != uVar6);
  }
  iVar8 = this->numColOriginal;
  if (0 < iVar8) {
    piVar2 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar9 = *piVar2;
    lVar11 = 0;
    do {
      iVar9 = iVar9 + local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar11];
      piVar2[lVar11 + 1] = iVar9;
      iVar8 = this->numColOriginal;
      lVar11 = lVar11 + 1;
    } while (lVar11 < iVar8);
    if (0 < iVar8) {
      piVar1 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar11 = 0;
      do {
        local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar11] = piVar1[lVar11];
        lVar11 = lVar11 + 1;
        iVar8 = this->numColOriginal;
      } while (lVar11 < iVar8);
    }
  }
  iVar9 = this->numRowOriginal;
  if (0 < iVar9) {
    piVar2 = (this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar1 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar8 = *piVar2;
    lVar11 = 0;
    do {
      lVar7 = lVar11 + 1;
      iVar10 = piVar2[lVar11 + 1];
      if (iVar8 < iVar10) {
        piVar3 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar4 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar5 = (this->ARvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar13 = (long)iVar8;
        do {
          iVar8 = piVar1[lVar13];
          if (iVar8 != this->numColOriginal) {
            iVar9 = local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar8];
            local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar8] = iVar9 + 1;
            piVar3[iVar9] = (int)lVar11;
            pdVar4[iVar9] = pdVar5[lVar13];
            iVar10 = piVar2[lVar7];
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < iVar10);
        iVar9 = this->numRowOriginal;
      }
      iVar8 = iVar10;
      lVar11 = lVar7;
    } while (lVar7 < iVar9);
    iVar8 = this->numColOriginal;
  }
  local_44 = 0;
  std::vector<int,_std::allocator<int>_>::resize(&this->Aend,(long)(iVar8 + 1),&local_44);
  if (0 < this->numColOriginal) {
    piVar1 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (this->Aend).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar11 = 0;
    do {
      piVar3[lVar11] = piVar1[lVar11 + 1];
      lVar11 = lVar11 + 1;
    } while (lVar11 < this->numColOriginal);
  }
  if (local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HPreData::makeACopy() {
    // Make a A copy

    int i,k;
    vector<int> iwork(numColOriginal, 0);
    Astart.assign(numColOriginal + 1, 0);
    int AcountX = ARindex.size();
    Aindex.resize(AcountX);
    Avalue.resize(AcountX);
    for (int k = 0; k < AcountX; k++)
    	if (ARindex[k] < numColOriginal)
    		iwork[ARindex[k]]++;
    for (i = 1; i <= numColOriginal; i++)
        Astart[i] = Astart[i - 1] + iwork[i - 1];
    for (i = 0; i < numColOriginal; i++)
        iwork[i] = Astart[i];
    for (int iRow = 0; iRow < numRowOriginal; iRow++) {
        for (k = ARstart[iRow]; k < ARstart[iRow + 1]; k++) {
            int iColumn = ARindex[k];
            if (iColumn != numColOriginal) {
				int iPut = iwork[iColumn]++;
				Aindex[iPut] = iRow;
				Avalue[iPut] = ARvalue[k];
            }
        }
    }

    Aend.resize(numColOriginal + 1, 0);
    for (i = 0; i < numColOriginal; i++)
        Aend[i] = Astart[i + 1];
}